

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threewisehash.h
# Opt level: O2

void __thiscall
ThreeWiseHash<unsigned_int,_unsigned_char>::update
          (ThreeWiseHash<unsigned_int,_unsigned_char> *this,uchar param_1,uchar inchar)

{
  value_type local_11;
  
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back(&this->ngram,&local_11);
  std::deque<unsigned_char,_std::allocator<unsigned_char>_>::pop_front(&this->ngram);
  __updateHashValue(this);
  return;
}

Assistant:

void update(chartype, chartype inchar) {
    ngram.push_back(inchar);
    ngram.pop_front();
    __updateHashValue();
  }